

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O2

void __thiscall
TPZStream::Read<int>(TPZStream *this,set<int,_std::less<int>,_std::allocator<int>_> *vec)

{
  int i;
  int iVar1;
  int nel;
  int val;
  
  (*this->_vptr_TPZStream[0x1d])(this,&nel,1);
  for (iVar1 = 0; iVar1 < nel; iVar1 = iVar1 + 1) {
    (*this->_vptr_TPZStream[0x1d])(this,&val,1);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)vec,&val)
    ;
  }
  return;
}

Assistant:

void Read(std::set<T> &vec) {
        if constexpr (std::is_same<std::string, T>::value || is_arithmetic_pz<T>::value){
        int nel;
        this->Read(&nel, 1);
        for (int i = 0; i < nel; i++) {
            T val;
            this->Read(&val);
            vec.insert(val);
        }
        }else{
            DebugStop();
        }
    }